

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O3

int main(int argc,char **argv)

{
  wasm_func_t *pwVar1;
  char cVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  FILE *__stream;
  size_t sVar6;
  long lVar7;
  wasm_memory_t *pwVar8;
  wasm_func_t *func;
  undefined8 uVar9;
  char *pcVar10;
  undefined8 uVar11;
  wasm_limits_t limits;
  wasm_byte_vec_t binary;
  wasm_extern_vec_t exports;
  wasm_extern_vec_t imports;
  wasm_val_t local_b8;
  undefined1 local_a8;
  undefined4 local_a0;
  wasm_func_t *local_90;
  undefined8 local_88;
  undefined8 local_80;
  long local_78;
  wasm_func_t *local_70;
  undefined1 local_68 [8];
  void *local_60;
  wasm_extern_vec_t local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  
  puts("Initializing...");
  uVar4 = wasm_engine_new();
  uVar5 = wasm_store_new(uVar4);
  puts("Loading binary...");
  __stream = fopen("memory.wasm","rb");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    sVar6 = ftell(__stream);
    fseek(__stream,0,0);
    wasm_byte_vec_new_uninitialized(local_68,sVar6);
    sVar6 = fread(local_60,sVar6,1,__stream);
    if (sVar6 == 1) {
      fclose(__stream);
      puts("Compiling module...");
      lVar7 = wasm_module_new(uVar5,local_68);
      if (lVar7 == 0) {
        pcVar10 = "> Error compiling module!";
      }
      else {
        wasm_byte_vec_delete(local_68);
        puts("Instantiating module...");
        local_48 = 0;
        uStack_40 = 0;
        local_78 = wasm_instance_new(uVar5,lVar7,&local_48,0);
        if (local_78 != 0) {
          puts("Extracting exports...");
          wasm_instance_exports(local_78);
          pwVar8 = get_export_memory(&local_58,0);
          local_70 = get_export_func(&local_58,1);
          func = get_export_func(&local_58,2);
          local_90 = get_export_func(&local_58,3);
          wasm_module_delete(lVar7);
          uVar9 = wasm_memory_copy(pwVar8);
          cVar2 = wasm_memory_same(pwVar8);
          if (cVar2 == '\0') {
            __assert_fail("wasm_memory_same(memory, copy)",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/third_party/wasm-c-api/example/memory.c"
                          ,0x9a,"int main(int, const char **)");
          }
          wasm_memory_delete(uVar9);
          puts("Checking memory...");
          iVar3 = wasm_memory_size(pwVar8);
          if ((((iVar3 == 2) && (lVar7 = wasm_memory_data_size(pwVar8), lVar7 == 0x20000)) &&
              (pcVar10 = (char *)wasm_memory_data(pwVar8), *pcVar10 == '\0')) &&
             ((lVar7 = wasm_memory_data(pwVar8), *(char *)(lVar7 + 0x1000) == '\x01' &&
              (local_88 = uVar4, local_80 = uVar5, lVar7 = wasm_memory_data(pwVar8),
              *(char *)(lVar7 + 0x1003) == '\x04')))) {
            check_call(local_70,0,(wasm_val_t *)0x0,2);
            local_b8._0_8_ = local_b8._0_8_ & 0xffffffffffffff00;
            local_b8.of.i32 = 0;
            check_call(func,1,&local_b8,0);
            local_b8._0_8_ = local_b8._0_8_ & 0xffffffffffffff00;
            local_b8.of.i32 = 0x1000;
            check_call(func,1,&local_b8,1);
            local_b8._0_8_ = local_b8._0_8_ & 0xffffffffffffff00;
            local_b8.of.f32 = 5.74392e-42;
            check_call(func,1,&local_b8,4);
            local_b8._0_8_ = local_b8._0_8_ & 0xffffffffffffff00;
            local_b8.of.i32 = 0x1ffff;
            check_call(func,1,&local_b8,0);
            local_b8._0_8_ = local_b8._0_8_ & 0xffffffffffffff00;
            local_b8.of.i32 = 0x20000;
            check_trap(func,1,&local_b8);
            puts("Mutating memory...");
            lVar7 = wasm_memory_data(pwVar8);
            pwVar1 = local_90;
            *(undefined1 *)(lVar7 + 0x1003) = 5;
            local_b8._0_8_ = local_b8._0_8_ & 0xffffffffffffff00;
            local_b8.of.f32 = 5.74252e-42;
            local_a8 = 0;
            local_a0 = 6;
            check_ok(local_90,2,&local_b8);
            local_b8._0_8_ = local_b8._0_8_ & 0xffffffffffffff00;
            local_b8.of.i32 = 0x20000;
            local_a8 = 0;
            local_a0 = 0;
            check_trap(pwVar1,2,&local_b8);
            lVar7 = wasm_memory_data(pwVar8);
            if ((*(char *)(lVar7 + 0x1002) == '\x06') &&
               (lVar7 = wasm_memory_data(pwVar8), *(char *)(lVar7 + 0x1003) == '\x05')) {
              local_b8._0_8_ = local_b8._0_8_ & 0xffffffffffffff00;
              local_b8.of.f32 = 5.74252e-42;
              check_call(func,1,&local_b8,6);
              local_b8._0_8_ = local_b8._0_8_ & 0xffffffffffffff00;
              local_b8.of.f32 = 5.74392e-42;
              check_call(func,1,&local_b8,5);
              puts("Growing memory...");
              cVar2 = wasm_memory_grow(pwVar8,1);
              if (((cVar2 != '\0') && (iVar3 = wasm_memory_size(pwVar8), iVar3 == 3)) &&
                 (lVar7 = wasm_memory_data_size(pwVar8), lVar7 == 0x30000)) {
                local_b8._0_8_ = local_b8._0_8_ & 0xffffffffffffff00;
                local_b8.of.i32 = 0x20000;
                check_call(func,1,&local_b8,0);
                pwVar1 = local_90;
                local_b8._0_8_ = local_b8._0_8_ & 0xffffffffffffff00;
                local_b8.of.i32 = 0x20000;
                local_a8 = 0;
                local_a0 = 0;
                check_ok(local_90,2,&local_b8);
                local_b8._0_8_ = local_b8._0_8_ & 0xffffffffffffff00;
                local_b8.of.i32 = 0x30000;
                check_trap(func,1,&local_b8);
                local_b8._0_8_ = local_b8._0_8_ & 0xffffffffffffff00;
                local_b8.of.i32 = 0x30000;
                local_a8 = 0;
                local_a0 = 0;
                check_trap(pwVar1,2,&local_b8);
                cVar2 = wasm_memory_grow(pwVar8,1);
                if ((cVar2 == '\0') &&
                   (cVar2 = wasm_memory_grow(pwVar8,0), uVar5 = local_80, uVar4 = local_88,
                   cVar2 != '\0')) {
                  wasm_extern_vec_delete(&local_58);
                  wasm_instance_delete(local_78);
                  puts("Creating stand-alone memory...");
                  local_b8._0_8_ = 0x500000005;
                  uVar9 = wasm_memorytype_new();
                  uVar11 = wasm_memory_new(uVar5,uVar9);
                  iVar3 = wasm_memory_size(uVar11);
                  if ((iVar3 == 5) &&
                     ((cVar2 = wasm_memory_grow(uVar11,1), cVar2 == '\0' &&
                      (cVar2 = wasm_memory_grow(uVar11,0), cVar2 != '\0')))) {
                    wasm_memorytype_delete(uVar9);
                    wasm_memory_delete(uVar11);
                    puts("Shutting down...");
                    wasm_store_delete(uVar5);
                    wasm_engine_delete(uVar4);
                    puts("Done.");
                    return 0;
                  }
                }
              }
            }
          }
          puts("> Error, expected success");
          exit(1);
        }
        pcVar10 = "> Error instantiating module!";
      }
      goto LAB_00101b3a;
    }
  }
  pcVar10 = "> Error loading module!";
LAB_00101b3a:
  puts(pcVar10);
  return 1;
}

Assistant:

int main(int argc, const char* argv[]) {
  // Initialize.
  printf("Initializing...\n");
  wasm_engine_t* engine = wasm_engine_new();
  wasm_store_t* store = wasm_store_new(engine);

  // Load binary.
  printf("Loading binary...\n");
  FILE* file = fopen("memory.wasm", "rb");
  if (!file) {
    printf("> Error loading module!\n");
    return 1;
  }
  fseek(file, 0L, SEEK_END);
  size_t file_size = ftell(file);
  fseek(file, 0L, SEEK_SET);
  wasm_byte_vec_t binary;
  wasm_byte_vec_new_uninitialized(&binary, file_size);
  if (fread(binary.data, file_size, 1, file) != 1) {
    printf("> Error loading module!\n");
    return 1;
  }
  fclose(file);

  // Compile.
  printf("Compiling module...\n");
  own wasm_module_t* module = wasm_module_new(store, &binary);
  if (!module) {
    printf("> Error compiling module!\n");
    return 1;
  }

  wasm_byte_vec_delete(&binary);

  // Instantiate.
  printf("Instantiating module...\n");
  wasm_extern_vec_t imports = WASM_EMPTY_VEC;
  own wasm_instance_t* instance =
    wasm_instance_new(store, module, &imports, NULL);
  if (!instance) {
    printf("> Error instantiating module!\n");
    return 1;
  }

  // Extract export.
  printf("Extracting exports...\n");
  own wasm_extern_vec_t exports;
  wasm_instance_exports(instance, &exports);
  size_t i = 0;
  wasm_memory_t* memory = get_export_memory(&exports, i++);
  wasm_func_t* size_func = get_export_func(&exports, i++);
  wasm_func_t* load_func = get_export_func(&exports, i++);
  wasm_func_t* store_func = get_export_func(&exports, i++);

  wasm_module_delete(module);

  // Try cloning.
  own wasm_memory_t* copy = wasm_memory_copy(memory);
  assert(wasm_memory_same(memory, copy));
  wasm_memory_delete(copy);

  // Check initial memory.
  printf("Checking memory...\n");
  check(wasm_memory_size(memory) == 2);
  check(wasm_memory_data_size(memory) == 0x20000);
  check(wasm_memory_data(memory)[0] == 0);
  check(wasm_memory_data(memory)[0x1000] == 1);
  check(wasm_memory_data(memory)[0x1003] == 4);

  check_call0(size_func, 2);
  check_call1(load_func, 0, 0);
  check_call1(load_func, 0x1000, 1);
  check_call1(load_func, 0x1003, 4);
  check_call1(load_func, 0x1ffff, 0);
  check_trap1(load_func, 0x20000);

  // Mutate memory.
  printf("Mutating memory...\n");
  wasm_memory_data(memory)[0x1003] = 5;
  check_ok2(store_func, 0x1002, 6);
  check_trap2(store_func, 0x20000, 0);

  check(wasm_memory_data(memory)[0x1002] == 6);
  check(wasm_memory_data(memory)[0x1003] == 5);
  check_call1(load_func, 0x1002, 6);
  check_call1(load_func, 0x1003, 5);

  // Grow memory.
  printf("Growing memory...\n");
  check(wasm_memory_grow(memory, 1));
  check(wasm_memory_size(memory) == 3);
  check(wasm_memory_data_size(memory) == 0x30000);

  check_call1(load_func, 0x20000, 0);
  check_ok2(store_func, 0x20000, 0);
  check_trap1(load_func, 0x30000);
  check_trap2(store_func, 0x30000, 0);

  check(! wasm_memory_grow(memory, 1));
  check(wasm_memory_grow(memory, 0));

  wasm_extern_vec_delete(&exports);
  wasm_instance_delete(instance);

  // Create stand-alone memory.
  // TODO(wasm+): Once Wasm allows multiple memories, turn this into import.
  printf("Creating stand-alone memory...\n");
  wasm_limits_t limits = {5, 5};
  own wasm_memorytype_t* memorytype = wasm_memorytype_new(&limits);
  own wasm_memory_t* memory2 = wasm_memory_new(store, memorytype);
  check(wasm_memory_size(memory2) == 5);
  check(! wasm_memory_grow(memory2, 1));
  check(wasm_memory_grow(memory2, 0));

  wasm_memorytype_delete(memorytype);
  wasm_memory_delete(memory2);

  // Shut down.
  printf("Shutting down...\n");
  wasm_store_delete(store);
  wasm_engine_delete(engine);

  // All done.
  printf("Done.\n");
  return 0;
}